

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void AddDrawListToDrawData(ImVector<ImDrawList_*> *out_list,ImDrawList *draw_list)

{
  int iVar1;
  uint uVar2;
  ImDrawCmd *pIVar3;
  uint uVar4;
  long lVar5;
  ImDrawList *local_18;
  
  iVar1 = (draw_list->CmdBuffer).Size;
  if (iVar1 != 0) {
    local_18 = draw_list;
    if (((iVar1 == 1) &&
        (pIVar3 = ImVector<ImDrawCmd>::operator[](&draw_list->CmdBuffer,0), pIVar3->ElemCount == 0))
       && (pIVar3 = ImVector<ImDrawCmd>::operator[](&draw_list->CmdBuffer,0),
          pIVar3->UserCallback == (ImDrawCallback)0x0)) {
      return;
    }
    uVar2 = (draw_list->VtxBuffer).Size;
    if (((long)(int)uVar2 != 0) &&
       (draw_list->_VtxWritePtr != (draw_list->VtxBuffer).Data + (int)uVar2)) {
      __assert_fail("draw_list->VtxBuffer.Size == 0 || draw_list->_VtxWritePtr == draw_list->VtxBuffer.Data + draw_list->VtxBuffer.Size"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x12bd,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
    }
    lVar5 = (long)(draw_list->IdxBuffer).Size;
    if ((lVar5 != 0) && (draw_list->_IdxWritePtr != (draw_list->IdxBuffer).Data + lVar5)) {
      __assert_fail("draw_list->IdxBuffer.Size == 0 || draw_list->_IdxWritePtr == draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x12be,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
    }
    uVar4 = draw_list->_VtxCurrentIdx;
    if (((draw_list->Flags & 8) == 0) && (uVar4 = uVar2, draw_list->_VtxCurrentIdx != uVar2)) {
      __assert_fail("(int)draw_list->_VtxCurrentIdx == draw_list->VtxBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x12c0,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
    }
    if (0xffff < uVar4) {
      __assert_fail("draw_list->_VtxCurrentIdx < (1 << 16) && \"Too many vertices in ImDrawList using 16-bit indices. Read comment above\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x12d2,"void AddDrawListToDrawData(ImVector<ImDrawList *> *, ImDrawList *)");
    }
    ImVector<ImDrawList_*>::push_back(out_list,&local_18);
  }
  return;
}

Assistant:

static void AddDrawListToDrawData(ImVector<ImDrawList*>* out_list, ImDrawList* draw_list)
{
    if (draw_list->CmdBuffer.Size == 0)
        return;
    if (draw_list->CmdBuffer.Size == 1 && draw_list->CmdBuffer[0].ElemCount == 0 && draw_list->CmdBuffer[0].UserCallback == NULL)
        return;

    // Draw list sanity check. Detect mismatch between PrimReserve() calls and incrementing _VtxCurrentIdx, _VtxWritePtr etc.
    // May trigger for you if you are using PrimXXX functions incorrectly.
    IM_ASSERT(draw_list->VtxBuffer.Size == 0 || draw_list->_VtxWritePtr == draw_list->VtxBuffer.Data + draw_list->VtxBuffer.Size);
    IM_ASSERT(draw_list->IdxBuffer.Size == 0 || draw_list->_IdxWritePtr == draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size);
    if (!(draw_list->Flags & ImDrawListFlags_AllowVtxOffset))
        IM_ASSERT((int)draw_list->_VtxCurrentIdx == draw_list->VtxBuffer.Size);

    // Check that draw_list doesn't use more vertices than indexable (default ImDrawIdx = unsigned short = 2 bytes = 64K vertices per ImDrawList = per window)
    // If this assert triggers because you are drawing lots of stuff manually:
    // - First, make sure you are coarse clipping yourself and not trying to draw many things outside visible bounds.
    //   Be mindful that the ImDrawList API doesn't filter vertices. Use the Metrics/Debugger window to inspect draw list contents.
    // - If you want large meshes with more than 64K vertices, you can either:
    //   (A) Handle the ImDrawCmd::VtxOffset value in your renderer backend, and set 'io.BackendFlags |= ImGuiBackendFlags_RendererHasVtxOffset'.
    //       Most example backends already support this from 1.71. Pre-1.71 backends won't.
    //       Some graphics API such as GL ES 1/2 don't have a way to offset the starting vertex so it is not supported for them.
    //   (B) Or handle 32-bit indices in your renderer backend, and uncomment '#define ImDrawIdx unsigned int' line in imconfig.h.
    //       Most example backends already support this. For example, the OpenGL example code detect index size at compile-time:
    //         glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer_offset);
    //       Your own engine or render API may use different parameters or function calls to specify index sizes.
    //       2 and 4 bytes indices are generally supported by most graphics API.
    // - If for some reason neither of those solutions works for you, a workaround is to call BeginChild()/EndChild() before reaching
    //   the 64K limit to split your draw commands in multiple draw lists.
    if (sizeof(ImDrawIdx) == 2)
        IM_ASSERT(draw_list->_VtxCurrentIdx < (1 << 16) && "Too many vertices in ImDrawList using 16-bit indices. Read comment above");

    out_list->push_back(draw_list);
}